

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.h
# Opt level: O1

char * __thiscall
Memory::HeapInfo::RealAlloc<(Memory::ObjectInfoBits)264,true>
          (HeapInfo *this,Recycler *recycler,size_t sizeCat,size_t size)

{
  code *pcVar1;
  bool bVar2;
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_> *this_00;
  char *pcVar3;
  char *address;
  undefined4 *in_FS_OFFSET;
  
  if ((sizeCat == 0) || (0x300 < sizeCat || (sizeCat & 0xf) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                       ,0x287,"(HeapInfo::IsAlignedSmallObjectSize(sizeCat))",
                       "HeapInfo::IsAlignedSmallObjectSize(sizeCat)");
    if (!bVar2) goto LAB_001bba80;
    *in_FS_OFFSET = 0;
  }
  this_00 = (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
             *)GetBucket<(Memory::ObjectInfoBits)256>(this,sizeCat);
  if ((this_00->super_HeapBucket).sizeCat != sizeCat) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.inl"
                       ,0xd,"(sizeCat == this->sizeCat)","sizeCat == this->sizeCat");
    if (!bVar2) {
LAB_001bba80:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *in_FS_OFFSET = 0;
  }
  pcVar3 = SmallHeapBlockAllocator<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
           ::InlinedAllocImpl<true>
                     (&this_00->allocatorHead,recycler,sizeCat,WithBarrierBit|ImplicitRootBit);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
             ::SnailAlloc(this_00,recycler,&this_00->allocatorHead,sizeCat,size,
                          WithBarrierBit|ImplicitRootBit,true);
  }
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    address = pcVar3;
    if ((this_00->super_HeapBucket).isPageHeapEnabled != true) {
      size = sizeCat - 0x10;
      address = pcVar3 + 8;
    }
    Recycler::VerifyZeroFill(recycler,address,size);
  }
  return pcVar3;
}

Assistant:

inline char *
HeapInfo::RealAlloc(Recycler * recycler, size_t sizeCat, size_t size)
{
    Assert(HeapInfo::IsAlignedSmallObjectSize(sizeCat));
    auto& bucket = this->GetBucket<(ObjectInfoBits)(attributes & GetBlockTypeBitMask)>(sizeCat);
    return bucket.template RealAlloc<attributes, nothrow>(recycler, sizeCat, size);
}